

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.cpp
# Opt level: O1

optional_ptr<duckdb::Catalog,_true>
duckdb::Catalog::GetCatalogEntry(ClientContext *context,string *catalog_name)

{
  optional_ptr<duckdb::Catalog,_true> oVar1;
  CatalogEntryRetriever entry_retriever;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  ClientContext *local_28;
  undefined8 local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_18;
  undefined8 local_10;
  
  local_38 = (code *)0x0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_20 = 0;
  p_Stack_18 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_10 = 0;
  local_28 = context;
  oVar1 = GetCatalogEntry((CatalogEntryRetriever *)&local_48,catalog_name);
  if (p_Stack_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_18);
  }
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,__destroy_functor);
  }
  return (optional_ptr<duckdb::Catalog,_true>)oVar1.ptr;
}

Assistant:

optional_ptr<CatalogEntry> Catalog::CreatePragmaFunction(CatalogTransaction transaction,
                                                         CreatePragmaFunctionInfo &info) {
	auto &schema = GetSchema(transaction, info.schema);
	return CreatePragmaFunction(transaction, schema, info);
}